

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void AddCommandString(char *cmd,int keynum)

{
  char cVar1;
  long lVar2;
  DWaitingCommand *this;
  char *cmd_00;
  char *pcVar4;
  char cVar5;
  int tics;
  bool bVar6;
  char *pcVar3;
  
  if (cmd == (char *)0x0) {
    return;
  }
LAB_0042a216:
  cVar5 = *cmd;
  cmd_00 = cmd;
  if (cVar5 == '\0') {
    return;
  }
  do {
    pcVar3 = cmd_00;
    if (cVar5 == '\"') {
      do {
        while( true ) {
          cmd_00 = pcVar3 + 1;
          cVar5 = *cmd_00;
          if (cVar5 == '\"') break;
          pcVar3 = cmd_00;
          if (cVar5 == '\0') goto LAB_0042a254;
        }
        cVar1 = *pcVar3;
        pcVar3 = cmd_00;
      } while (cVar1 == '\\');
    }
    else if ((cVar5 == '\0') || (cVar5 == ';')) break;
LAB_0042a254:
    bVar6 = cVar5 != '\0';
    cVar5 = cmd_00[bVar6];
    cmd_00 = cmd_00 + bVar6;
  } while( true );
  if (cVar5 == ';') {
    *cmd_00 = '\0';
  }
  pcVar3 = cmd + 4;
  do {
    pcVar4 = pcVar3;
    cVar1 = pcVar4[-4];
    if (cVar1 == '\0') break;
    pcVar3 = pcVar4 + 1;
  } while (cVar1 < '!');
  if (cVar1 != '\0') {
    if ((((cVar1 == 'w') && (ParsingKeyConf == false)) && (pcVar4[-3] == 'a')) &&
       ((pcVar4[-2] == 'i' && (pcVar4[-1] == 't')))) {
      if (*pcVar4 == ' ') {
        lVar2 = strtol(pcVar4 + 1,(char **)0x0,0);
        tics = (int)lVar2;
        if (tics < 1) goto LAB_0042a2bf;
LAB_0042a2ec:
        if (cVar5 != ';') {
          return;
        }
        *cmd_00 = ';';
        this = (DWaitingCommand *)DObject::operator_new(0x48);
        DWaitingCommand::DWaitingCommand(this,cmd_00,tics);
        return;
      }
      if (*pcVar4 == '\0') {
        tics = 1;
        goto LAB_0042a2ec;
      }
    }
    C_DoCommand(pcVar4 + -4,keynum);
  }
LAB_0042a2bf:
  if (cVar5 == ';') {
    *cmd_00 = ';';
  }
  cmd = cmd_00 + (cVar5 == ';');
  goto LAB_0042a216;
}

Assistant:

void AddCommandString (char *cmd, int keynum)
{
	char *brkpt;
	int more;

	if (cmd)
	{
		while (*cmd)
		{
			brkpt = cmd;
			while (*brkpt != ';' && *brkpt != '\0')
			{
				if (*brkpt == '\"')
				{
					brkpt++;
					while (*brkpt != '\0' && (*brkpt != '\"' || *(brkpt-1) == '\\'))
						brkpt++;
				}
				if (*brkpt != '\0')
					brkpt++;
			}
			if (*brkpt == ';')
			{
				*brkpt = '\0';
				more = 1;
			}
			else
			{
				more = 0;
			}
			// Intercept wait commands here. Note: wait must be lowercase
			while (*cmd && *cmd <= ' ')
				cmd++;
			if (*cmd)
			{
				if (!ParsingKeyConf &&
					cmd[0] == 'w' && cmd[1] == 'a' && cmd[2] == 'i' && cmd[3] == 't' &&
					(cmd[4] == 0 || cmd[4] == ' '))
				{
					int tics;

					if (cmd[4] == ' ')
					{
						tics = strtol (cmd + 5, NULL, 0);
					}
					else
					{
						tics = 1;
					}
					if (tics > 0)
					{
						if (more)
						{ // The remainder of the command will be executed later
						  // Note that deferred commands lose track of which key
						  // (if any) they were pressed from.
							*brkpt = ';';
							new DWaitingCommand (brkpt, tics);
						}
						return;
					}
				}
				else
				{
					C_DoCommand (cmd, keynum);
				}
			}
			if (more)
			{
				*brkpt = ';';
			}
			cmd = brkpt + more;
		}
	}
}